

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.c
# Opt level: O2

int uv__random(void *buf,size_t buflen)

{
  int iVar1;
  
  iVar1 = uv__random_getrandom(buf,buflen);
  if (iVar1 == -0x26) {
    iVar1 = uv__random_devurandom(buf,buflen);
  }
  if ((iVar1 + 0x28U < 0x28) && ((0xc808030001U >> ((ulong)(iVar1 + 0x28U) & 0x3f) & 1) != 0)) {
    iVar1 = uv__random_sysctl(buf,buflen);
    return iVar1;
  }
  return iVar1;
}

Assistant:

static int uv__random(void* buf, size_t buflen) {
  int rc;

#if defined(__PASE__)
  rc = uv__random_readpath("/dev/urandom", buf, buflen);
#elif defined(_AIX)
  rc = uv__random_readpath("/dev/random", buf, buflen);
#elif defined(__APPLE__) || defined(__OpenBSD__) || \
     (defined(__ANDROID_API__) && __ANDROID_API__ >= 28)
  rc = uv__random_getentropy(buf, buflen);
  if (rc == UV_ENOSYS)
    rc = uv__random_devurandom(buf, buflen);
#elif defined(__NetBSD__)
  rc = uv__random_sysctl(buf, buflen);
#elif defined(__FreeBSD__) || defined(__linux__)
  rc = uv__random_getrandom(buf, buflen);
  if (rc == UV_ENOSYS)
    rc = uv__random_devurandom(buf, buflen);
# if defined(__linux__)
  switch (rc) {
    case UV_EACCES:
    case UV_EIO:
    case UV_ELOOP:
    case UV_EMFILE:
    case UV_ENFILE:
    case UV_ENOENT:
    case UV_EPERM:
      rc = uv__random_sysctl(buf, buflen);
      break;
  }
# endif
#elif defined(_WIN32)
  uv__once_init();
  rc = uv__random_rtlgenrandom(buf, buflen);
#else
  rc = uv__random_devurandom(buf, buflen);
#endif

  return rc;
}